

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

ITestingV2 * trun::TestResponseProxy::GetTRTestInterfaceV2(void)

{
  return &GetTRTestInterfaceV2::trp_bridge_v2;
}

Assistant:

ITestingV2 *TestResponseProxy::GetTRTestInterfaceV2() {
    static ITestingV2 trp_bridge_v2 = {
            .Debug = int_trp_debug,
            .Info = int_trp_info,
            .Warning = int_trp_warning,
            .Error = int_trp_error,
            .Fatal = int_trp_fatal,
            .Abort = int_trp_abort,
            .AssertError = int_trp_assert_error_v2,
            .SetPreCaseCallback = int_trp_hook_precase_v2,
            .SetPostCaseCallback = int_trp_hook_postcase_v2,
            .CaseDepends = int_trp_casedepend,
            .ModuleDepends = int_trp_moduledepend,
            .QueryInterface = int_trp_query_interface,
    };
    return &trp_bridge_v2;
}